

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void __thiscall Controller::HandleInput(Controller *this,bool *running,Snake *snake)

{
  int iVar1;
  SDL_Event e;
  int local_58 [5];
  int local_44;
  
  iVar1 = SDL_PollEvent(local_58);
  while (iVar1 != 0) {
    if (local_58[0] == 0x300) {
      if (local_44 == this->_Up) {
        if ((snake->direction != kDown) || (snake->size == 1)) {
          snake->direction = kUp;
        }
      }
      else if (local_44 == this->_Down) {
        if ((snake->direction != kUp) || (snake->size == 1)) {
          snake->direction = kDown;
        }
      }
      else if (local_44 == this->_Left) {
        if ((snake->direction != kRight) || (snake->size == 1)) {
          snake->direction = kLeft;
        }
      }
      else if ((snake->direction != kLeft) || (snake->size == 1)) {
        snake->direction = kRight;
      }
    }
    else if (local_58[0] == 0x100) {
      *running = false;
    }
    iVar1 = SDL_PollEvent(local_58);
  }
  return;
}

Assistant:

void Controller::HandleInput(bool &running, Snake &snake) const {
  SDL_Event e;
  while (SDL_PollEvent(&e)) {
    if (e.type == SDL_QUIT) {
      running = false;
    } else if (e.type == SDL_KEYDOWN) {
      
      if(e.key.keysym.sym == _Up)
          ChangeDirection(snake, Snake::Direction::kUp,Snake::Direction::kDown);
      else if(e.key.keysym.sym == _Down)
          ChangeDirection(snake, Snake::Direction::kDown,Snake::Direction::kUp);
      else if(e.key.keysym.sym == _Left)
          ChangeDirection(snake, Snake::Direction::kLeft,Snake::Direction::kRight);
      else
          ChangeDirection(snake, Snake::Direction::kRight, Snake::Direction::kLeft);
    }
  }
}